

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O1

void __thiscall
amrex::DistributionMapping::KnapSackProcessorMap
          (DistributionMapping *this,BoxArray *boxes,int nprocs)

{
  element_type *peVar1;
  long lVar2;
  long extraout_RDX;
  int iVar3;
  long lVar4;
  vector<long,_std::allocator<long>_> wgts;
  Real effi;
  vector<long,_std::allocator<long>_> local_68;
  Box local_50;
  
  peVar1 = (boxes->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             (this->m_ref).
             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             ((long)*(pointer *)
                     ((long)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data + 8) -
              *(long *)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data >> 2) * 0x6db6db6db6db6db7);
  if ((1 < nprocs) &&
     (peVar1 = (boxes->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     lVar2 = ((long)*(pointer *)
                     ((long)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                             super__Vector_impl_data + 8) -
              *(long *)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data >> 2) * 0x6db6db6db6db6db7,
     lVar2 - nprocs != 0 && nprocs <= lVar2)) {
    std::vector<long,_std::allocator<long>_>::vector
              (&local_68,
               ((long)*(pointer *)
                       ((long)&(peVar1->m_abox).
                               super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                               super__Vector_impl_data + 8) -
                *(long *)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data >> 2) * 0x6db6db6db6db6db7,
               (allocator_type *)&local_50);
    peVar1 = (boxes->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar3 = (int)((long)*(pointer *)
                         ((long)&(peVar1->m_abox).
                                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                                 .super__Vector_impl_data + 8) -
                  *(long *)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data >> 2) * -0x49249249;
    lVar2 = extraout_RDX;
    if (iVar3 != 0) {
      lVar4 = 0;
      do {
        BATransformer::operator()
                  (&local_50,&boxes->m_bat,
                   (Box *)((long)(int)lVar4 * 0x1c +
                          *(long *)&(((boxes->m_ref).
                                      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr)->m_abox).
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data));
        lVar2 = (long)((local_50.bigend.vect[2] - local_50.smallend.vect[2]) + 1) *
                (long)((local_50.bigend.vect[0] - local_50.smallend.vect[0]) + 1) *
                (long)((local_50.bigend.vect[1] - local_50.smallend.vect[1]) + 1);
        local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar4] = lVar2;
        lVar4 = lVar4 + 1;
      } while (iVar3 != (int)lVar4);
    }
    local_50.smallend.vect[0] = 0;
    local_50.smallend.vect[1] = 0;
    KnapSackDoIt(this,&local_68,(int)lVar2,(Real *)&local_50,true,0x7fffffff,true);
    if (local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  RoundRobinProcessorMap(this,boxes,nprocs);
  return;
}

Assistant:

void
DistributionMapping::KnapSackProcessorMap (const BoxArray& boxes,
                                           int             nprocs)
{
    BL_ASSERT(boxes.size() > 0);

    m_ref->m_pmap.resize(boxes.size());

    if (boxes.size() <= nprocs || nprocs < 2)
    {
        RoundRobinProcessorMap(boxes,nprocs);
    }
    else
    {
        std::vector<Long> wgts(boxes.size());

        for (unsigned int i = 0, N = boxes.size(); i < N; ++i)
            wgts[i] = boxes[i].numPts();

        Real effi = 0;
        bool do_full_knapsack = true;
        KnapSackDoIt(wgts, nprocs, effi, do_full_knapsack);
    }
}